

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir-gen.c
# Opt level: O0

void minimize_ssa(gen_ctx_t gen_ctx,size_t insns_num)

{
  FILE *__stream;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  bb_insn_t_conflict pbVar4;
  size_t sVar5;
  size_t sVar6;
  bb_insn_t_conflict local_88;
  bb_insn_t_conflict bb_insn;
  bb_t_conflict bb;
  insn_var_iterator_t iter;
  MIR_reg_t var;
  int change_p;
  int op_num;
  size_t saved_bound;
  size_t j;
  size_t i;
  bb_insn_t_conflict def;
  bb_insn_t_conflict phi;
  MIR_insn_t insn;
  size_t insns_num_local;
  gen_ctx_t gen_ctx_local;
  
  insn = (MIR_insn_t)insns_num;
  insns_num_local = (size_t)gen_ctx;
  VARR_bb_insn_ttrunc(gen_ctx->ssa_ctx->deleted_phis,0);
  do {
    bVar1 = false;
    _change_p = 0;
    for (j = 0; sVar5 = j,
        sVar3 = VARR_bb_insn_tlength
                          (*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x10)),
        sVar5 < sVar3; j = j + 1) {
      def = VARR_bb_insn_tget(*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x10),j);
      for (saved_bound = 1; saved_bound < *(ulong *)&def->insn->field_0x18 >> 0x20;
          saved_bound = saved_bound + 1) {
        pbVar4 = skip_redundant_phis((bb_insn_t_conflict)def->insn->ops[saved_bound].data);
        def->insn->ops[saved_bound].data = pbVar4;
      }
      i = (size_t)redundant_phi_def((gen_ctx_t)insns_num_local,def,(int *)&var);
      sVar5 = _change_p;
      if ((bb_insn_t_conflict)i == (bb_insn_t_conflict)0x0) {
        _change_p = _change_p + 1;
        VARR_bb_insn_tset(*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x10),sVar5,def)
        ;
      }
      else {
        def->insn->ops[0].data = (void *)i;
        if (def == (bb_insn_t_conflict)i) {
          __assert_fail("phi != def",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir-gen.c"
                        ,0x912,"void minimize_ssa(gen_ctx_t, size_t)");
        }
        VARR_bb_insn_tpush(*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x18),def);
        bVar1 = true;
      }
    }
    VARR_bb_insn_ttrunc(*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x10),_change_p);
    if (!bVar1) {
      if ((*(long *)(insns_num_local + 0x18) != 0) && (1 < *(int *)(insns_num_local + 0x20))) {
        __stream = *(FILE **)(insns_num_local + 0x18);
        sVar5 = VARR_bb_insn_tlength
                          (*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x18));
        sVar3 = VARR_bb_insn_tlength
                          (*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x10));
        sVar6 = VARR_bb_insn_tlength
                          (*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x10));
        fprintf(__stream,"Minimizing SSA phis: from %ld to %ld phis (non-phi insns %ld)\n",
                sVar5 + sVar3,sVar6,insn);
      }
      for (bb_insn = (bb_insn_t_conflict)
                     DLIST_bb_t_head((DLIST_bb_t *)(*(long *)(insns_num_local + 0x108) + 0x18));
          bb_insn != (bb_insn_t_conflict)0x0;
          bb_insn = (bb_insn_t_conflict)DLIST_bb_t_next((bb_t_conflict)bb_insn)) {
        for (local_88 = DLIST_bb_insn_t_head((DLIST_bb_insn_t *)&bb_insn->label_disp);
            local_88 != (bb_insn_t_conflict)0x0; local_88 = DLIST_bb_insn_t_next(local_88)) {
          phi = (bb_insn_t_conflict)local_88->insn;
          insn_var_iterator_init((insn_var_iterator_t *)&bb,(MIR_insn_t)phi);
          while (iVar2 = input_insn_var_iterator_next
                                   ((gen_ctx_t)insns_num_local,(insn_var_iterator_t *)&bb,
                                    (MIR_reg_t *)((long)&iter.op_part_num + 4),(int *)&var),
                iVar2 != 0) {
            if ((&phi->bb_insn_link)[(long)(int)var * 3].prev != (bb_insn_t)0x0) {
              pbVar4 = skip_redundant_phis((&phi->bb_insn_link)[(long)(int)var * 3].prev);
              (&phi->bb_insn_link)[(long)(int)var * 3].prev = pbVar4;
            }
          }
        }
      }
      for (j = 0; sVar5 = j,
          sVar3 = VARR_bb_insn_tlength
                            (*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x18)),
          sVar5 < sVar3; j = j + 1) {
        def = VARR_bb_insn_tget(*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x18),j);
        gen_delete_insn((gen_ctx_t)insns_num_local,def->insn);
      }
      for (j = 0; sVar5 = j,
          sVar3 = VARR_bb_insn_tlength
                            (*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x10)),
          sVar5 < sVar3; j = j + 1) {
        def = VARR_bb_insn_tget(*(VARR_bb_insn_t **)(*(long *)(insns_num_local + 0x148) + 0x10),j);
        def->insn->ops[0].data = (void *)0x0;
      }
      return;
    }
  } while( true );
}

Assistant:

static void minimize_ssa (gen_ctx_t gen_ctx, size_t insns_num) {
  MIR_insn_t insn;
  bb_insn_t phi, def;
  size_t i, j, saved_bound;
  int op_num, change_p;
  MIR_reg_t var;
  insn_var_iterator_t iter;

  VARR_TRUNC (bb_insn_t, deleted_phis, 0);
  do {
    change_p = FALSE;
    saved_bound = 0;
    for (i = 0; i < VARR_LENGTH (bb_insn_t, phis); i++) {
      phi = VARR_GET (bb_insn_t, phis, i);
      for (j = 1; j < phi->insn->nops; j++)
        phi->insn->ops[j].data = skip_redundant_phis (phi->insn->ops[j].data);
      if ((def = redundant_phi_def (gen_ctx, phi, &op_num)) == NULL) {
        VARR_SET (bb_insn_t, phis, saved_bound++, phi);
        continue;
      }
      phi->insn->ops[0].data = def;
      gen_assert (phi != def);
      VARR_PUSH (bb_insn_t, deleted_phis, phi);
      change_p = TRUE;
    }
    VARR_TRUNC (bb_insn_t, phis, saved_bound);
  } while (change_p);
  DEBUG (2, {
    fprintf (debug_file, "Minimizing SSA phis: from %ld to %ld phis (non-phi insns %ld)\n",
             (long) VARR_LENGTH (bb_insn_t, deleted_phis) + (long) VARR_LENGTH (bb_insn_t, phis),
             (long) VARR_LENGTH (bb_insn_t, phis), (long) insns_num);
  });
  for (bb_t bb = DLIST_HEAD (bb_t, curr_cfg->bbs); bb != NULL; bb = DLIST_NEXT (bb_t, bb))
    for (bb_insn_t bb_insn = DLIST_HEAD (bb_insn_t, bb->bb_insns); bb_insn != NULL;
         bb_insn = DLIST_NEXT (bb_insn_t, bb_insn)) {
      insn = bb_insn->insn;
      FOREACH_IN_INSN_VAR (gen_ctx, iter, insn, var, op_num) {
        if (insn->ops[op_num].data == NULL) continue;
        insn->ops[op_num].data = skip_redundant_phis (insn->ops[op_num].data);
      }
    }
  for (i = 0; i < VARR_LENGTH (bb_insn_t, deleted_phis); i++) {
    phi = VARR_GET (bb_insn_t, deleted_phis, i);
    gen_delete_insn (gen_ctx, phi->insn);
  }
  for (i = 0; i < VARR_LENGTH (bb_insn_t, phis); i++) {
    phi = VARR_GET (bb_insn_t, phis, i);
    phi->insn->ops[0].data = NULL;
  }
}